

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpwm.cc
# Opt level: O2

void __thiscall UnpackerTPWM::UnpackerTPWM(UnpackerTPWM *this,PBuffer *_buffer)

{
  element_type *_size;
  bool bVar1;
  ExceptionFreeserf *pEVar2;
  allocator<char> local_61;
  PBuffer id;
  string local_50;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  Convertor::Convertor(&this->super_Convertor,(PBuffer *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001527b8;
  _size = (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr;
  if (_size->size < 8) {
    pEVar2 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Data is not TPWM archive",(allocator<char> *)&id);
    ExceptionFreeserf::ExceptionFreeserf(pEVar2,&local_50);
    __cxa_throw(pEVar2,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  Buffer::pop((Buffer *)&id,(size_t)_size);
  Buffer::operator_cast_to_string
            (&local_50,id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = std::operator!=(&local_50,"TPWM");
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  pEVar2 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Data is not TPWM archive",&local_61);
  ExceptionFreeserf::ExceptionFreeserf(pEVar2,&local_50);
  __cxa_throw(pEVar2,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

UnpackerTPWM::UnpackerTPWM(PBuffer _buffer) : Convertor(_buffer) {
  if (buffer->get_size() < 8) {
    throw ExceptionFreeserf("Data is not TPWM archive");
  }

  PBuffer id = buffer->pop(4);
  if ((std::string)*id.get() != "TPWM") {
    throw ExceptionFreeserf("Data is not TPWM archive");
  }
}